

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O0

void __thiscall OpenMD::CutoffGroup::addAtom(CutoffGroup *this,Atom *atom)

{
  value_type *in_RDI;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *unaff_retaddr;
  
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::push_back(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void addAtom(Atom* atom) { cutoffAtomList.push_back(atom); }